

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall Assimp::OpenGEX::OpenGEXImporter::copyMeshes(OpenGEXImporter *this,aiScene *pScene)

{
  pointer puVar1;
  pointer puVar2;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var3;
  ulong uVar4;
  aiMesh **ppaVar5;
  uint uVar6;
  
  if (pScene != (aiScene *)0x0) {
    puVar1 = (this->m_meshCache).
             super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_meshCache).
             super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      uVar4 = (long)puVar2 - (long)puVar1;
      uVar6 = (uint)(uVar4 >> 3);
      pScene->mNumMeshes = uVar6;
      ppaVar5 = (aiMesh **)operator_new__(uVar4 & 0x7fffffff8);
      pScene->mMeshes = ppaVar5;
      if (uVar6 != 0) {
        uVar4 = 0;
        do {
          puVar1 = (this->m_meshCache).
                   super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
               puVar1[uVar4]._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t;
          puVar1[uVar4]._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t =
               (tuple<aiMesh_*,_std::default_delete<aiMesh>_>)0x0;
          ((tuple<aiMesh_*,_std::default_delete<aiMesh>_> *)(pScene->mMeshes + uVar4))->
          super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_> =
               (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)
               _Var3._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
               super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
          uVar4 = uVar4 + 1;
        } while (uVar4 < pScene->mNumMeshes);
      }
    }
    return;
  }
  __assert_fail("nullptr != pScene",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                ,0x47d,"void Assimp::OpenGEX::OpenGEXImporter::copyMeshes(aiScene *)");
}

Assistant:

void OpenGEXImporter::copyMeshes( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if( m_meshCache.empty() ) {
        return;
    }

    pScene->mNumMeshes = static_cast<unsigned int>(m_meshCache.size());
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];
    for (unsigned int i = 0; i < pScene->mNumMeshes; i++) {
        pScene->mMeshes[i] = m_meshCache[i].release();
    }
}